

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structured_bindings.cpp
# Opt level: O2

void printVector<unsigned_long>(vector<unsigned_long,_std::allocator<unsigned_long>_> *vector)

{
  pointer puVar1;
  ostream *poVar2;
  unsigned_long *elem;
  pointer puVar3;
  
  std::operator<<((ostream *)&std::cout,"[ ");
  puVar1 = (vector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (vector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)&std::cout,"]");
  return;
}

Assistant:

void printVector(const std::vector<T>& vector)
{
    std::cout << "[ ";
    for (const auto& elem: vector)
    {
        std::cout << elem << " ";
    }
    std::cout << "]";
}